

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O0

string * basisu::string_get_extension(string *filename)

{
  string *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  int dot;
  int sep;
  string *result;
  string *psVar1;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  allocator<char> local_19;
  int local_18;
  int local_14;
  string *__s;
  
  local_14 = 0xffffffff;
  psVar1 = in_RDI;
  __s = in_RDI;
  local_14 = string_find_right((string *)
                               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                               (char)((ulong)in_RDI >> 0x38));
  local_18 = string_find_right((string *)
                               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                               (char)((ulong)psVar1 >> 0x38));
  if (local_14 < local_18) {
    std::__cxx11::string::string((string *)in_RDI,in_RSI);
    std::__cxx11::string::erase((ulong)in_RDI,0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (unaff_retaddr,(char *)__s,(allocator<char> *)in_RSI);
    std::allocator<char>::~allocator(&local_19);
  }
  return psVar1;
}

Assistant:

inline std::string string_get_extension(const std::string &filename)
	{
		int sep = -1;
#ifdef _WIN32
		sep = string_find_right(filename, '\\');
#endif
		if (sep < 0)
			sep = string_find_right(filename, '/');

		int dot = string_find_right(filename, '.');
		if (dot <= sep)
			return "";

		std::string result(filename);
		result.erase(0, dot + 1);

		return result;
	}